

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall fmt::v9::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  size_t sVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  
  if (other->exp_ < this->exp_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xab6,"unaligned bigints");
  }
  iVar4 = compare(this,other);
  if (iVar4 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xab7,"");
  }
  uVar5 = other->exp_ - this->exp_;
  sVar1 = (other->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar1 == 0) {
    uVar6 = 0;
  }
  else {
    puVar2 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar8 = 0;
    lVar9 = 0;
    do {
      if ((int)uVar5 < 0) goto LAB_00129ecb;
      uVar6 = (ulong)puVar3[uVar5 + sVar8] + (lVar9 - (ulong)puVar2[sVar8]);
      puVar3[uVar5 + sVar8] = (uint)uVar6;
      lVar9 = (long)uVar6 >> 0x3f;
      sVar8 = sVar8 + 1;
    } while (sVar1 != sVar8);
    uVar6 = uVar6 >> 0x3f;
    uVar5 = uVar5 + (int)sVar8;
  }
  if ((int)uVar6 != 0) {
    if ((int)uVar5 < 0) {
LAB_00129ecb:
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                  ,0x199,"negative value");
    }
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar7 = (ulong)puVar2[uVar5];
    do {
      uVar7 = (uVar7 & 0xffffffff) - uVar6;
      uVar6 = uVar7 >> 0x3f;
    } while ((long)uVar7 < 0);
    puVar2[uVar5] = (uint)uVar7;
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }